

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNTDG.cpp
# Opt level: O0

void __thiscall
NaPNTrainDataGath::set_parameters
          (NaPNTrainDataGath *this,int n_stpardet,int n_cells,NaReal n_sigma,NaReal percent)

{
  NaReal local_48;
  int local_3c;
  NaReal local_38;
  int local_2c;
  NaReal percent_local;
  NaReal n_sigma_local;
  int n_cells_local;
  int n_stpardet_local;
  NaPNTrainDataGath *this_local;
  
  local_2c = n_stpardet;
  if (n_stpardet < 1) {
    local_2c = 1;
  }
  this->nStDetLen = local_2c;
  local_38 = percent;
  if (percent < 0.0) {
    local_38 = 0.0;
  }
  this->fMinHits = local_38;
  local_3c = n_cells;
  if (n_cells < 1) {
    local_3c = 1;
  }
  this->par[1].nCells = local_3c;
  this->par[0].nCells = local_3c;
  local_48 = n_sigma;
  if (n_sigma <= 0.0) {
    local_48 = 1.0;
  }
  this->par[1].fNSigma = local_48;
  this->par[0].fNSigma = local_48;
  return;
}

Assistant:

void
NaPNTrainDataGath::set_parameters (int n_stpardet, int n_cells,
				   NaReal n_sigma, NaReal percent)
{
  nStDetLen = (n_stpardet < 1)? 1: n_stpardet;
  fMinHits = (percent < 0)? 0.0: percent;

  par[0].nCells = par[1].nCells = (n_cells < 1)? 1: n_cells;
  par[0].fNSigma = par[1].fNSigma = (n_sigma <= 0.0)? 1.0: n_sigma;
}